

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseTerm(Parser *this)

{
  bool bVar1;
  Mark *pMVar2;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pointer this_01;
  Token *pTVar3;
  Tokenizer *in_RSI;
  allocator<char> *in_RDI;
  __single_object node_1;
  Token identifierToken;
  __single_object node;
  Token token;
  Mark mark;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *expr;
  Token *in_stack_fffffffffffffd88;
  Token *in_stack_fffffffffffffd90;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  *in_stack_fffffffffffffd98;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  _Head_base<0UL,_ExpressionNode_*,_false> __s;
  Parser *in_stack_fffffffffffffe38;
  Tokenizer *in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffee7;
  Parser *in_stack_fffffffffffffee8;
  optional<Token> *in_stack_ffffffffffffff70;
  Parser *in_stack_ffffffffffffff78;
  TokenType local_50;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  Mark local_18 [3];
  
  __s._M_head_impl = (ExpressionNode *)in_RDI;
  pMVar2 = Tokenizer::getMark((Tokenizer *)0x19cc26);
  local_18[0] = *pMVar2;
  Tokenizer::peek(in_RSI);
  Token::Token(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  if (local_50 == Number) {
    Tokenizer::nextToken(in_stack_fffffffffffffe78);
    Token::~Token((Token *)0x19cc7a);
    std::get<double,std::__cxx11::string,double>
              ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)0x19cc87);
    std::make_unique<NumericLiteralNode,double&>(in_stack_fffffffffffffda8);
    this_00 = std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::
              operator->((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *
                         )0x19ccaf);
    Node::setMark((Node *)this_00,local_18);
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
    unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>,void>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
              ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
               in_stack_fffffffffffffd90);
  }
  else if ((local_50 == Identifier) || (bVar1 = Token::isSpecialFunction((Token *)&local_50), bVar1)
          ) {
    Token::Token(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Tokenizer::nextToken(in_stack_fffffffffffffe78);
    Token::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Token::~Token((Token *)0x19cda6);
    if (local_50 == LParen) {
      std::optional<Token>::optional<const_Token_&,_true>
                ((optional<Token> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      parseFunctionCall(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::optional<Token>::~optional((optional<Token> *)0x19cdf1);
    }
    else {
      __args = std::get<std::__cxx11::string,std::__cxx11::string,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)0x19ce4d);
      std::make_unique<VariableNode,std::__cxx11::string_const&>(__args);
      this_01 = std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::operator->
                          ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)0x19ce75)
      ;
      Node::setMark((Node *)this_01,local_18);
      std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
      unique_ptr<VariableNode,std::default_delete<VariableNode>,void>
                (in_stack_fffffffffffffda0,
                 (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
                 in_stack_fffffffffffffd98);
      std::unique_ptr<VariableNode,_std::default_delete<VariableNode>_>::~unique_ptr
                ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)
                 in_stack_fffffffffffffd90);
    }
    Token::~Token((Token *)0x19cee3);
  }
  else {
    if (local_50 != LParen) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                 (char *)__s._M_head_impl,in_RDI);
      reportError((Parser *)in_stack_ffffffffffffffd0,(string *)in_stack_ffffffffffffffc8);
    }
    Tokenizer::nextToken(in_stack_fffffffffffffe78);
    Token::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Token::~Token((Token *)0x19cf3e);
    if (local_50 == Backslash) {
      parseLambdaCall(in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
    }
    else {
      parseLogicalExpression(in_stack_fffffffffffffe38);
      pTVar3 = Tokenizer::peek(in_RSI);
      if (pTVar3->type != RParen) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                   (char *)__s._M_head_impl,in_RDI);
        reportError((Parser *)in_stack_ffffffffffffffd0,(string *)in_stack_ffffffffffffffc8);
      }
      Tokenizer::nextToken(in_stack_fffffffffffffe78);
      Token::~Token((Token *)0x19cfc3);
    }
  }
  Token::~Token((Token *)0x19d126);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)__s._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseTerm()
{
  const auto mark = tokenizer_.getMark();
  auto token = tokenizer_.peek();
  if(token.type == TokenType::Number)
  {
    tokenizer_.nextToken();
    auto node = std::make_unique<NumericLiteralNode>(std::get<double>(token.value));
    node->setMark(mark);
    return node;
  }
  else if(token.type == TokenType::Identifier || Token::isSpecialFunction(token))
  {
    const auto identifierToken = token;
    token = tokenizer_.nextToken();
    if(token.type == TokenType::LParen)
      return parseFunctionCall(identifierToken);
    else
    {
      auto node = std::make_unique<VariableNode>(std::get<std::string>(identifierToken.value));
      node->setMark(mark);
      return node;
    }
  }
  else if(token.type == TokenType::LParen)
  {
    token = tokenizer_.nextToken();
    if(token.type == TokenType::Backslash)
      return parseLambdaCall(true);

    auto expr = parseLogicalExpression();
    if(tokenizer_.peek().type == TokenType::RParen)
    {
      tokenizer_.nextToken();
      return expr;
    }
    else
      reportError("Expected closing parenthesis!");
  }
  else
    reportError("Expected number, identifier of function call!");

  return nullptr;
}